

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O1

void Frc_DumpGraphIntoFile(Frc_Man_t *p)

{
  uint *puVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  FILE *__stream;
  int iVar6;
  uint uVar7;
  long lVar8;
  
  if (0 < p->nObjData) {
    uVar5 = 0;
    iVar6 = 0;
    do {
      piVar3 = p->pObjData;
      if (piVar3 == (int *)0x0) break;
      puVar1 = (uint *)(piVar3 + iVar6);
      uVar4 = uVar5;
      uVar7 = 0xffffffff;
      if (iVar6 != 0) {
        uVar2 = *puVar1;
        if (((uVar2 & 1) != 0) && (0 < (long)(int)puVar1[1])) {
          lVar8 = 0;
          do {
            if ((puVar1[piVar3[(ulong)(uVar2 >> 4) + (long)iVar6 + lVar8 + 6]] & 2) == 0)
            goto LAB_00736dd5;
            lVar8 = lVar8 + 1;
          } while ((int)puVar1[1] != lVar8);
        }
        if (0xf < uVar2 && (uVar2 & 3) == 0) {
LAB_00736dd5:
          uVar4 = uVar5 + 1;
          uVar7 = uVar5;
        }
      }
      uVar5 = uVar4;
      puVar1[5] = uVar7;
      iVar6 = iVar6 + (*puVar1 >> 4) + puVar1[1] + 6;
    } while (iVar6 < p->nObjData);
  }
  __stream = fopen("x\\large\\aig\\dg1.g","w");
  if (0 < p->nObjData) {
    iVar6 = 0;
    do {
      if (p->pObjData == (int *)0x0) break;
      puVar1 = (uint *)(p->pObjData + iVar6);
      uVar5 = puVar1[1];
      if (0 < (int)uVar5) {
        lVar8 = 0;
        do {
          if ((puVar1[5] != 0xffffffff) &&
             (puVar1[(long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar8 + 6] + 5] != 0xffffffff)) {
            fprintf(__stream,"%d %d\n");
          }
          uVar5 = puVar1[1];
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 < (int)uVar5);
      }
      iVar6 = iVar6 + uVar5 + (*puVar1 >> 4) + 6;
    } while (iVar6 < p->nObjData);
  }
  fclose(__stream);
  return;
}

Assistant:

void Frc_DumpGraphIntoFile( Frc_Man_t * p )
{
    FILE * pFile;
    Frc_Obj_t * pThis, * pNext;
    int i, k, Counter = 0;
    // assign numbers to CIs and internal nodes
    Frc_ManForEachObj( p, pThis, i )
    {
        if ( i && ((Frc_ObjIsCi(pThis) && !Frc_ObjFanoutsAreCos(pThis)) || Frc_ObjIsNode(pThis)) )
            pThis->iFanin = Counter++;
        else
            pThis->iFanin = ~0;
    }
    // assign numbers to all other nodes
    pFile = fopen( "x\\large\\aig\\dg1.g", "w" );
    Frc_ManForEachObj( p, pThis, i )
    {
        Frc_ObjForEachFanout( pThis, pNext, k )
        {
            if ( ~pThis->iFanin && ~pNext->iFanin )
                fprintf( pFile, "%d %d\n", pThis->iFanin, pNext->iFanin );
        }
    }
    fclose( pFile );
}